

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtx_init.c
# Opt level: O2

int mtx_init(mtx_t *mtx,int type)

{
  if ((type & 1U) == 0) {
    *(uchar *)((long)mtx + 0x10) = '\0';
    *(uchar *)((long)mtx + 0x11) = '\0';
    *(uchar *)((long)mtx + 0x12) = '\0';
    *(uchar *)((long)mtx + 0x13) = '\0';
    *(uchar *)((long)mtx + 0x14) = '\0';
    *(uchar *)((long)mtx + 0x15) = '\0';
    *(uchar *)((long)mtx + 0x16) = '\0';
    *(uchar *)((long)mtx + 0x17) = '\0';
    *(uchar *)((long)mtx + 0x18) = '\0';
    *(uchar *)((long)mtx + 0x19) = '\0';
    *(uchar *)((long)mtx + 0x1a) = '\0';
    *(uchar *)((long)mtx + 0x1b) = '\0';
    *(uchar *)((long)mtx + 0x1c) = '\0';
    *(uchar *)((long)mtx + 0x1d) = '\0';
    *(uchar *)((long)mtx + 0x1e) = '\0';
    *(uchar *)((long)mtx + 0x1f) = '\0';
    mtx->_PDCLIB_mtx_t_align = 0;
    *(uchar *)((long)mtx + 8) = '\0';
    *(uchar *)((long)mtx + 9) = '\0';
    *(uchar *)((long)mtx + 10) = '\0';
    *(uchar *)((long)mtx + 0xb) = '\0';
    *(uchar *)((long)mtx + 0xc) = '\0';
    *(uchar *)((long)mtx + 0xd) = '\0';
    *(uchar *)((long)mtx + 0xe) = '\0';
    *(uchar *)((long)mtx + 0xf) = '\0';
  }
  else {
    mtx->_PDCLIB_mtx_t_align = 0;
    *(uchar *)((long)mtx + 8) = '\0';
    *(uchar *)((long)mtx + 9) = '\0';
    *(uchar *)((long)mtx + 10) = '\0';
    *(uchar *)((long)mtx + 0xb) = '\0';
    *(uchar *)((long)mtx + 0xc) = '\0';
    *(uchar *)((long)mtx + 0xd) = '\0';
    *(uchar *)((long)mtx + 0xe) = '\0';
    *(uchar *)((long)mtx + 0xf) = '\0';
    mtx->_PDCLIB_mtx_t_data[0x10] = '\x01';
    *(uchar *)((long)mtx + 0x11) = '\0';
    *(uchar *)((long)mtx + 0x12) = '\0';
    *(uchar *)((long)mtx + 0x13) = '\0';
    *(uchar *)((long)mtx + 0x14) = '\0';
    *(uchar *)((long)mtx + 0x15) = '\0';
    *(uchar *)((long)mtx + 0x16) = '\0';
    *(uchar *)((long)mtx + 0x17) = '\0';
    *(uchar *)((long)mtx + 0x18) = '\0';
    *(uchar *)((long)mtx + 0x19) = '\0';
    *(uchar *)((long)mtx + 0x1a) = '\0';
    *(uchar *)((long)mtx + 0x1b) = '\0';
    *(uchar *)((long)mtx + 0x1c) = '\0';
    *(uchar *)((long)mtx + 0x1d) = '\0';
    *(uchar *)((long)mtx + 0x1e) = '\0';
    *(uchar *)((long)mtx + 0x1f) = '\0';
    *(uchar *)((long)mtx + 0x20) = '\0';
  }
  *(uchar *)((long)mtx + 0x20) = '\0';
  *(uchar *)((long)mtx + 0x21) = '\0';
  *(uchar *)((long)mtx + 0x22) = '\0';
  *(uchar *)((long)mtx + 0x23) = '\0';
  *(uchar *)((long)mtx + 0x24) = '\0';
  *(uchar *)((long)mtx + 0x25) = '\0';
  *(uchar *)((long)mtx + 0x26) = '\0';
  *(uchar *)((long)mtx + 0x27) = '\0';
  return 1;
}

Assistant:

int mtx_init( mtx_t * mtx, int type )
{
    /* As far as I could figure out from Pthread documentation, there is
       no special requirement for a Pthread mutex to support timeout (the
       default "fast" mutex already supports that). So the only thing we
       check for in type is whether the mutex shall be recursive or not.
    */
    if ( type & mtx_recursive )
    {
        _PDCLIB_mtx_t recursive_mutex = _PDCLIB_MTX_RECURSIVE_INIT;
        *mtx = recursive_mutex;
    }
    else
    {
        _PDCLIB_mtx_t plain_mutex = _PDCLIB_MTX_PLAIN_INIT;
        *mtx = plain_mutex;
    }

    return thrd_success;
}